

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLScanner::getURIText(XMLScanner *this,uint uriId,XMLBuffer *uriBufToFill)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *value;
  XMLBuffer *uriBufToFill_local;
  uint uriId_local;
  XMLScanner *this_local;
  
  uVar1 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[7])
                    (this->fURIStringPool,(ulong)uriId);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                      (this->fURIStringPool,(ulong)uriId);
    if ((XMLCh *)CONCAT44(extraout_var,iVar2) == (XMLCh *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      XMLBuffer::set(uriBufToFill,(XMLCh *)CONCAT44(extraout_var,iVar2));
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool XMLScanner::getURIText(  const   unsigned int    uriId
                      ,       XMLBuffer&      uriBufToFill) const
{
    if (fURIStringPool->exists(uriId)) {
        // Look up the URI in the string pool and return its id
        const XMLCh* value = fURIStringPool->getValueForId(uriId);
        if (!value)
            return false;

        uriBufToFill.set(value);
        return true;
    }
    else
        return false;
}